

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeMaybeBlock(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Expression *pEVar2;
  
  if (this->nesting < (this->fuzzParams->super_FuzzParams).NESTING_LIMIT) {
    bVar1 = Random::oneIn(&this->random,3);
    if (!bVar1) {
      pEVar2 = makeBlock(this,type);
      return pEVar2;
    }
  }
  pEVar2 = make(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeMaybeBlock(Type type) {
  // if past the limit, prefer not to emit blocks
  if (nesting >= fuzzParams->NESTING_LIMIT || oneIn(3)) {
    return make(type);
  } else {
    return makeBlock(type);
  }
}